

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_48 [2];
  void *pInt;
  Mutex mutex;
  pthread_t another;
  pthread_t one;
  
  Mutex::Mutex((Mutex *)&pInt);
  pthread_create(&another,(pthread_attr_t *)0x0,produce,(Mutex *)&pInt);
  pthread_create((pthread_t *)(mutex.m_mutex.__size + 0x20),(pthread_attr_t *)0x0,produce,
                 (Mutex *)&pInt);
  pthread_join(another,(void **)local_48);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_48[0]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pthread_join((pthread_t)mutex.m_mutex.__data.__list.__next,(void **)0x0);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,globalInt);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Mutex::~Mutex((Mutex *)&pInt);
  return 0;
}

Assistant:

int main()
{
	pthread_t one, another;
	Mutex mutex;
	pthread_create(&one, NULL, produce, &mutex);
	pthread_create(&another, NULL, produce, &mutex);
	void * pInt;
	pthread_join(one, (&pInt));
	cout << *((int *)(&pInt)) << endl;
	pthread_join(another, NULL);
	cout << globalInt << endl;
	
}